

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilityEval.cpp
# Opt level: O0

int32_t ProbMap::checkFd(string *ele,char base,string2int32 *fd_map)

{
  bool bVar1;
  pointer ppVar2;
  undefined8 in_RDI;
  const_iterator res;
  Iter<true> in_stack_ffffffffffffffc0;
  key_type *key;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  int32_t local_4;
  
  key = (key_type *)in_stack_ffffffffffffffc0.mInfo;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffc0.mKeyVals,(char)((ulong)in_RDI >> 0x38));
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::find(in_stack_ffffffffffffffd0,key);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x10edc5);
  bVar1 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::Iter<true>::operator==
                    ((Iter<true> *)&stack0xffffffffffffffd0,(Iter<true> *)&stack0xffffffffffffffc0);
  if (bVar1) {
    local_4 = 0;
  }
  else {
    ppVar2 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Iter<true>::operator->((Iter<true> *)0x10edf8);
    local_4 = ppVar2->second;
  }
  return local_4;
}

Assistant:

int32_t ProbMap::checkFd(string ele, char base, const string2int32 &fd_map) {
    ele += base;
    auto res = fd_map.find(ele);
    if (res == fd_map.end()) {
        return 0;
    } else {
        return res->second;
    }
}